

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O3

PipelineResourceLayoutDescX * __thiscall
Diligent::PipelineResourceLayoutDescX::SyncDesc
          (PipelineResourceLayoutDescX *this,bool UpdateStrings)

{
  pointer pIVar1;
  Uint32 UVar2;
  pointer pIVar3;
  pointer pIVar4;
  undefined7 in_register_00000031;
  iterator __begin3;
  pointer pIVar5;
  pointer pIVar6;
  Char **ppCVar7;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar8;
  
  pIVar5 = (pointer)(this->VarCopy).
                    super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (pointer)(this->VarCopy).
                    super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  UVar2 = (Uint32)((ulong)((long)pIVar1 - (long)pIVar5) >> 4);
  (this->super_PipelineResourceLayoutDesc).NumVariables = UVar2;
  pIVar3 = pIVar5;
  if (UVar2 == 0) {
    pIVar3 = (pointer)0x0;
  }
  (this->super_PipelineResourceLayoutDesc).Variables = (ShaderResourceVariableDesc *)pIVar3;
  pIVar3 = (this->ImtblSamCopy).
           super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pIVar6 = (this->ImtblSamCopy).
           super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
           ._M_impl.super__Vector_impl_data._M_start;
  UVar2 = (int)((ulong)((long)pIVar3 - (long)pIVar6) >> 3) * 0x38e38e39;
  (this->super_PipelineResourceLayoutDesc).NumImmutableSamplers = UVar2;
  pIVar4 = (pointer)0x0;
  if (UVar2 != 0) {
    pIVar4 = pIVar6;
  }
  (this->super_PipelineResourceLayoutDesc).ImmutableSamplers = pIVar4;
  if ((int)CONCAT71(in_register_00000031,UpdateStrings) != 0) {
    if (pIVar5 != pIVar1) {
      do {
        pVar8 = std::
                _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::_M_emplace<char_const*&>
                          ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)&this->StringPool,pIVar5);
        *(undefined8 *)pIVar5 =
             *(undefined8 *)
              ((long)pVar8.first.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              + 8);
        pIVar5 = (pointer)&pIVar5->Desc;
      } while (pIVar5 != pIVar1);
      pIVar6 = (this->ImtblSamCopy).
               super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar3 = (this->ImtblSamCopy).
               super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (pIVar6 != pIVar3) {
      ppCVar7 = &pIVar6->SamplerOrTextureName;
      do {
        pVar8 = std::
                _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::_M_emplace<char_const*&>
                          ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)&this->StringPool,ppCVar7);
        *ppCVar7 = *(Char **)((long)pVar8.first.
                                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    ._M_cur.
                                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             + 8);
        pIVar5 = (pointer)(ppCVar7 + 8);
        ppCVar7 = ppCVar7 + 9;
      } while (pIVar5 != pIVar3);
    }
  }
  return this;
}

Assistant:

PipelineResourceLayoutDescX& SyncDesc(bool UpdateStrings = false)
    {
        NumVariables = static_cast<Uint32>(VarCopy.size());
        Variables    = NumVariables > 0 ? VarCopy.data() : nullptr;

        NumImmutableSamplers = static_cast<Uint32>(ImtblSamCopy.size());
        ImmutableSamplers    = NumImmutableSamplers > 0 ? ImtblSamCopy.data() : nullptr;

        if (UpdateStrings)
        {
            for (auto& Var : VarCopy)
                Var.Name = StringPool.emplace(Var.Name).first->c_str();

            for (auto& Sam : ImtblSamCopy)
                Sam.SamplerOrTextureName = StringPool.emplace(Sam.SamplerOrTextureName).first->c_str();
        }

        return *this;
    }